

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow_tests.cpp
# Opt level: O0

void __thiscall
pow_tests::CheckProofOfWork_test_biger_hash_than_target::test_method
          (CheckProofOfWork_test_biger_hash_than_target *this)

{
  long lVar1;
  uint256 hash_00;
  bool bVar2;
  uint32_t uVar3;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  uint nBits;
  arith_uint256 hash_arith;
  uint256 hash;
  Params consensus;
  CChainParams *in_stack_fffffffffffffd08;
  basic_cstring<const_char> *v;
  lazy_ostream *in_stack_fffffffffffffd10;
  _Base_ptr in_stack_fffffffffffffd18;
  uint256 *in_stack_fffffffffffffd20;
  uint32_t b32;
  base_uint<256U> *in_stack_fffffffffffffd28;
  Params *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  uint in_stack_fffffffffffffd3c;
  lazy_ostream *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  ChainType in_stack_fffffffffffffd5c;
  undefined1 in_stack_fffffffffffffd74 [12];
  iterator in_stack_fffffffffffffd88;
  lazy_ostream local_258 [2];
  assertion_result local_238 [2];
  basic_cstring<const_char> *in_stack_fffffffffffffe28;
  lazy_ostream *in_stack_fffffffffffffe30;
  _Base_ptr in_stack_fffffffffffffe38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CreateChainParams((ArgsManager *)&stack0xfffffffffffffe00,in_stack_fffffffffffffd5c);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::operator->
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffd08);
  CChainParams::GetConsensus(in_stack_fffffffffffffd08);
  Consensus::Params::Params
            ((Params *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             in_stack_fffffffffffffd30);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             in_stack_fffffffffffffd18);
  uint256::uint256((uint256 *)in_stack_fffffffffffffd08);
  UintToArith256(in_stack_fffffffffffffd20);
  b32 = (uint32_t)((ulong)in_stack_fffffffffffffd20 >> 0x20);
  uVar3 = arith_uint256::GetCompact
                    ((arith_uint256 *)in_stack_fffffffffffffd28,
                     SUB81((ulong)in_stack_fffffffffffffd20 >> 0x38,0));
  base_uint<256U>::operator*=(in_stack_fffffffffffffd28,b32);
  ArithToUint256((arith_uint256 *)in_stack_fffffffffffffd18);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
               (pointer)in_stack_fffffffffffffd10,(unsigned_long)in_stack_fffffffffffffd08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
               (const_string *)in_stack_fffffffffffffd40,
               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
               (const_string *)in_stack_fffffffffffffd30);
    hash_00.super_base_blob<256U>.m_data._M_elems[4] = in_stack_fffffffffffffd74[0];
    hash_00.super_base_blob<256U>.m_data._M_elems[5] = in_stack_fffffffffffffd74[1];
    hash_00.super_base_blob<256U>.m_data._M_elems[6] = in_stack_fffffffffffffd74[2];
    hash_00.super_base_blob<256U>.m_data._M_elems[7] = in_stack_fffffffffffffd74[3];
    hash_00.super_base_blob<256U>.m_data._M_elems[8] = in_stack_fffffffffffffd74[4];
    hash_00.super_base_blob<256U>.m_data._M_elems[9] = in_stack_fffffffffffffd74[5];
    hash_00.super_base_blob<256U>.m_data._M_elems[10] = in_stack_fffffffffffffd74[6];
    hash_00.super_base_blob<256U>.m_data._M_elems[0xb] = in_stack_fffffffffffffd74[7];
    hash_00.super_base_blob<256U>.m_data._M_elems[0xc] = in_stack_fffffffffffffd74[8];
    hash_00.super_base_blob<256U>.m_data._M_elems[0xd] = in_stack_fffffffffffffd74[9];
    hash_00.super_base_blob<256U>.m_data._M_elems[0xe] = in_stack_fffffffffffffd74[10];
    hash_00.super_base_blob<256U>.m_data._M_elems[0xf] = in_stack_fffffffffffffd74[0xb];
    hash_00.super_base_blob<256U>.m_data._M_elems[0] = (char)uVar3;
    hash_00.super_base_blob<256U>.m_data._M_elems[1] = (char)(uVar3 >> 8);
    hash_00.super_base_blob<256U>.m_data._M_elems[2] = (char)(uVar3 >> 0x10);
    hash_00.super_base_blob<256U>.m_data._M_elems[3] = (char)(uVar3 >> 0x18);
    hash_00.super_base_blob<256U>.m_data._M_elems[0x10] = (char)in_RDI;
    hash_00.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)in_RDI >> 8);
    hash_00.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)in_RDI >> 0x10);
    hash_00.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)in_RDI >> 0x18);
    hash_00.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)in_RDI >> 0x20);
    hash_00.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)in_RDI >> 0x28);
    hash_00.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)in_RDI >> 0x30);
    hash_00.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)in_RDI >> 0x38);
    hash_00.super_base_blob<256U>.m_data._M_elems._24_8_ = in_stack_fffffffffffffd88;
    v = in_stack_fffffffffffffe28;
    in_stack_fffffffffffffd10 = in_stack_fffffffffffffe30;
    in_stack_fffffffffffffd18 = in_stack_fffffffffffffe38;
    in_stack_fffffffffffffd4f =
         CheckProofOfWork(hash_00,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd30);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffd18,
               SUB81((ulong)in_stack_fffffffffffffd10 >> 0x38,0));
    in_stack_fffffffffffffd40 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
               (pointer)in_stack_fffffffffffffd10,(unsigned_long)v);
    boost::unit_test::operator<<(in_stack_fffffffffffffd10,v);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
               (pointer)in_stack_fffffffffffffd10,(unsigned_long)v);
    in_stack_fffffffffffffd08 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_238,local_258,(const_string *)&stack0xfffffffffffffd88,0x7b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffd08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd08);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffffd3c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd3c);
  } while (bVar2);
  Consensus::Params::~Params(&in_stack_fffffffffffffd08->consensus);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(CheckProofOfWork_test_biger_hash_than_target)
{
    const auto consensus = CreateChainParams(*m_node.args, ChainType::MAIN)->GetConsensus();
    uint256 hash;
    unsigned int nBits;
    arith_uint256 hash_arith = UintToArith256(consensus.powLimit);
    nBits = hash_arith.GetCompact();
    hash_arith *= 2; // hash > nBits
    hash = ArithToUint256(hash_arith);
    BOOST_CHECK(!CheckProofOfWork(hash, nBits, consensus));
}